

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall
inja::Parser::append_callback(Parser *this,Template *tmpl,string_view name,uint num_args)

{
  pointer pBVar1;
  const_pointer pcVar2;
  uint local_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar2 = name.data_;
  pBVar1 = (tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4c = num_args;
  if ((((tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
        _M_impl.super__Vector_impl_data._M_start == pBVar1) || (pBVar1[-1].op != Push)) ||
     ((*(uint *)&pBVar1[-1].field_0x4 & 0xc0000000) != 0x40000000)) {
    local_48[0] = (undefined1 *)CONCAT71(local_48[0]._1_7_,0x29);
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op,unsigned_int&>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,(Op *)local_48,
               &local_4c);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar2,pcVar2 + name.size_);
    std::__cxx11::string::operator=
              ((string *)
               &(tmpl->bytecodes).
                super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].str,(string *)local_48);
  }
  else {
    pBVar1[-1].op = Callback;
    *(uint *)&pBVar1[-1].field_0x4 = num_args & 0x3fffffff | 0x40000000;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar2,pcVar2 + name.size_);
    std::__cxx11::string::operator=((string *)&pBVar1[-1].str,(string *)local_48);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void append_callback(Template& tmpl, nonstd::string_view name, unsigned int num_args) {
		// we can merge with back-to-back push value (not lookup)
		if (!tmpl.bytecodes.empty()) {
			Bytecode& last = tmpl.bytecodes.back();
			if (last.op == Bytecode::Op::Push &&
				(last.flags & Bytecode::Flag::ValueMask) == Bytecode::Flag::ValueImmediate) {
				last.op = Bytecode::Op::Callback;
				last.args = num_args;
				last.str = static_cast<std::string>(name);
				return;
			}
		}

		// otherwise just add it to the end
		tmpl.bytecodes.emplace_back(Bytecode::Op::Callback, num_args);
		tmpl.bytecodes.back().str = static_cast<std::string>(name);
	}